

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linecurve.cpp
# Opt level: O0

bool __thiscall ON_LineCurve::ChangeDimension(ON_LineCurve *this,int desired_dimension)

{
  ON_3dPoint *pOVar1;
  double *pdVar2;
  bool local_16;
  bool rc;
  int desired_dimension_local;
  ON_LineCurve *this_local;
  
  local_16 = 1 < desired_dimension && desired_dimension < 4;
  if ((1 < desired_dimension && desired_dimension < 4) && (this->m_dim != desired_dimension)) {
    ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
    if (desired_dimension == 2) {
      if (((this->m_line).from.x != -1.23432101234321e+308) || (NAN((this->m_line).from.x))) {
        (this->m_line).from.z = 0.0;
      }
      pOVar1 = &(this->m_line).to;
      if ((pOVar1->x != -1.23432101234321e+308) || (NAN(pOVar1->x))) {
        (this->m_line).to.z = 0.0;
      }
      this->m_dim = 2;
    }
    else {
      if (this->m_dim == 2) {
        if (((((this->m_line).from.x != -1.23432101234321e+308) || (NAN((this->m_line).from.x))) &&
            (pdVar2 = &(this->m_line).from.z, *pdVar2 == -1.23432101234321e+308)) && (!NAN(*pdVar2))
           ) {
          (this->m_line).from.z = 0.0;
        }
        if ((((this->m_line).from.x != -1.23432101234321e+308) || (NAN((this->m_line).from.x))) &&
           ((pdVar2 = &(this->m_line).to.z, *pdVar2 == -1.23432101234321e+308 && (!NAN(*pdVar2)))))
        {
          (this->m_line).from.z = 0.0;
        }
      }
      this->m_dim = 3;
    }
  }
  return local_16;
}

Assistant:

bool ON_LineCurve::ChangeDimension( int desired_dimension )
{
  bool rc = (desired_dimension>=2 && desired_dimension<=3);

  if (rc && m_dim != desired_dimension )
  {
    DestroyCurveTree();
    if ( desired_dimension == 2 )
    {
      // 7 April 2003 Dale Lear - zero z coords if x coord are set
      if( ON_UNSET_VALUE != m_line.from.x )
        m_line.from.z = 0.0;
      if( ON_UNSET_VALUE != m_line.to.x )
        m_line.to.z = 0.0;
      m_dim = 2;
    }
    else
    {
      if ( 2 == m_dim  )
      {
        // 7 April 2003 Dale Lear
        // zero z coords if x coords are set and z coords are not set
        if( ON_UNSET_VALUE != m_line.from.x && ON_UNSET_VALUE == m_line.from.z )
          m_line.from.z = 0.0;
        if( ON_UNSET_VALUE != m_line.from.x && ON_UNSET_VALUE == m_line.to.z )
          m_line.from.z = 0.0;
      }
      m_dim = 3;
    }
  }

  return rc;
}